

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long>
WeakHashLen32WithSeeds(uint64 w,uint64 x,uint64 y,uint64 z,uint64 a,uint64 b)

{
  uint64 uVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  unsigned_long local_60;
  unsigned_long local_58;
  uint64 local_50;
  uint64 c;
  uint64 b_local;
  uint64 a_local;
  uint64 z_local;
  uint64 y_local;
  uint64 x_local;
  uint64 w_local;
  
  b_local = a + w;
  c = b;
  a_local = z;
  z_local = y;
  y_local = x;
  x_local = w;
  c = Rotate(b + b_local + z,0x15);
  local_50 = b_local;
  b_local = b_local + y_local + z_local;
  uVar1 = Rotate(b_local,0x2c);
  c = c + uVar1;
  local_58 = b_local + a_local;
  local_60 = c + local_50;
  pVar2 = std::make_pair<unsigned_long,unsigned_long>(&local_58,&local_60);
  return pVar2;
}

Assistant:

static pair<uint64, uint64> WeakHashLen32WithSeeds(
    uint64 w, uint64 x, uint64 y, uint64 z, uint64 a, uint64 b) {
  a += w;
  b = Rotate(b + a + z, 21);
  uint64 c = a;
  a += x;
  a += y;
  b += Rotate(a, 44);
  return make_pair(a + z, b + c);
}